

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Formatter_inl.hpp
# Opt level: O2

string * __thiscall
CLI::Formatter::make_option_desc_abi_cxx11_
          (string *__return_storage_ptr__,Formatter *this,Option *opt)

{
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&opt->description_);
  return __return_storage_ptr__;
}

Assistant:

CLI11_INLINE std::string Formatter::make_option_desc(const Option *opt) const { return opt->get_description(); }